

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

void __thiscall QRegularExpressionPrivate::cleanCompiledPattern(QRegularExpressionPrivate *this)

{
  long in_RDI;
  
  pcre2_code_free_16(*(undefined8 *)(in_RDI + 0x28));
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0xffffffffffffffff;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined1 *)(in_RDI + 0x44) = 0;
  return;
}

Assistant:

void QRegularExpressionPrivate::cleanCompiledPattern()
{
    pcre2_code_free_16(compiledPattern);
    compiledPattern = nullptr;
    errorCode = 0;
    errorOffset = -1;
    capturingCount = 0;
    usingCrLfNewlines = false;
}